

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm::forward_int8
          (Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int *piVar2;
  char cVar3;
  float *pfVar4;
  size_type sVar5;
  reference top_blob_00;
  Option *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar6;
  Mat *top_blob;
  int broadcast_type_C;
  Mat C;
  int N;
  int M;
  int j_2;
  char *ptr_5;
  int i_5;
  Mat BT_int8;
  int k_3;
  char *ptrBi;
  float *ptr_4;
  int B_hstep_1;
  int i_4;
  int k_2;
  float *ptr_3;
  int B_hstep;
  int i_3;
  float absmax_1;
  float B_int8_scale;
  Mat B0_int8;
  int k_1;
  char *ptrAi;
  float A_int8_scale;
  int k;
  float absmax;
  float *ptr_2;
  int A_hstep;
  int i_2;
  Mat A_int8_scales;
  Mat A_int8;
  int j_1;
  float *ptr_1;
  int i_1;
  int j;
  char *ptr;
  int i;
  Mat A;
  Mat *B0;
  Mat *A0;
  Mat *m;
  undefined8 in_stack_fffffffffffff5b0;
  Allocator *in_stack_fffffffffffff5b8;
  Allocator *in_stack_fffffffffffff5c0;
  int in_stack_fffffffffffff5c8;
  int in_stack_fffffffffffff5cc;
  undefined4 in_stack_fffffffffffff5d0;
  int in_stack_fffffffffffff5d4;
  int in_stack_fffffffffffff5d8;
  int in_stack_fffffffffffff5dc;
  Mat *in_stack_fffffffffffff5e0;
  bool local_9d2;
  int local_930;
  float local_92c;
  int local_90c;
  float local_8cc;
  int local_8ac;
  undefined4 local_86c;
  const_reference local_810;
  const_reference local_808;
  const_reference local_800;
  int local_7dc;
  value_type local_7d8;
  int local_78c;
  int local_788;
  int local_784;
  void *local_780;
  int local_774;
  Mat local_770;
  int local_724;
  void *local_720;
  void *local_718;
  int local_710;
  int local_70c;
  float local_708;
  int local_704;
  void *local_700;
  int local_6f8;
  int local_6f4;
  float local_6f0;
  float local_6ec;
  Mat local_6e8;
  int local_69c;
  void *local_698;
  float local_690;
  float local_68c;
  int local_688;
  float local_684;
  void *local_680;
  int local_678;
  int local_674;
  Mat local_670;
  Mat local_628;
  char local_5d9;
  void *local_5d8;
  int *local_5d0;
  ulong local_5c8;
  int local_5c0;
  Allocator *local_5b8;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  undefined4 local_5a4;
  int local_5a0;
  ulong local_598;
  int local_58c;
  void *local_588;
  int local_580;
  int local_57c;
  void *local_578;
  int local_570;
  value_type local_560;
  const_reference local_518;
  const_reference local_510;
  Option *local_508;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_500;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_4f8;
  int local_4e4;
  value_type *local_4e0;
  Mat *local_4d8;
  value_type *local_4d0;
  void **local_4c8;
  value_type *local_4b8;
  Mat *local_4a8;
  Mat *local_498;
  Mat *local_488;
  Mat *local_478;
  value_type *local_468;
  int local_458;
  undefined4 local_454;
  const_reference local_450;
  const_reference local_448;
  const_reference local_440;
  int local_438;
  undefined4 local_434;
  const_reference local_430;
  const_reference local_428;
  const_reference local_420;
  int local_418;
  undefined4 local_414;
  const_reference local_410;
  const_reference local_408;
  const_reference local_400;
  int local_3f8;
  undefined4 local_3f4;
  value_type *local_3f0;
  value_type *local_3e8;
  value_type *local_3e0;
  int local_3d8;
  undefined4 local_3d4;
  Mat *local_3d0;
  Mat *local_3c8;
  Mat *local_3c0;
  int local_3b8;
  undefined4 local_3b4;
  const_reference local_3b0;
  const_reference local_3a8;
  const_reference local_3a0;
  reference local_398;
  value_type *local_390;
  long local_388;
  Mat *local_380;
  int local_374;
  value_type *local_370;
  long local_368;
  void **local_360;
  int local_354;
  Mat *local_350;
  int local_344;
  Mat *local_340;
  int local_334;
  Mat *local_330;
  int local_324;
  value_type *local_320;
  int local_314;
  const_reference local_310;
  undefined1 local_305;
  int local_304;
  const_reference local_300;
  void **local_2f8;
  int local_2e4;
  const_reference local_2e0;
  value_type *local_2d8;
  Mat *local_2d0;
  long *local_2c8;
  Mat *local_2c0;
  const_reference local_2b8;
  Mat *local_2b0;
  value_type *local_2a8;
  const_reference local_2a0;
  const_reference local_298;
  int local_28c;
  Mat *local_288;
  const_reference local_268;
  Mat *local_258;
  value_type *local_248;
  int local_240;
  undefined4 local_23c;
  const_reference local_238;
  int local_230;
  undefined4 local_22c;
  const_reference local_228;
  int local_220;
  undefined4 local_21c;
  const_reference local_218;
  int local_200;
  undefined4 local_1fc;
  value_type *local_1f8;
  int local_1e0;
  undefined4 local_1dc;
  Mat *local_1d8;
  int local_1c0;
  undefined4 local_1bc;
  Mat *local_1b8;
  int local_1a0;
  undefined4 local_19c;
  Mat *local_198;
  int local_180;
  undefined4 local_17c;
  Mat *local_178;
  int local_160;
  undefined4 local_15c;
  value_type *local_158;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  void *local_130;
  void *local_120;
  void *local_110;
  void *local_100;
  void *local_f0;
  void *local_e0;
  void *local_d0;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  value_type *local_88;
  reference local_80;
  Allocator *local_78;
  int local_6c;
  ulong local_68;
  void *local_60;
  int local_54;
  int local_50;
  int local_4c;
  void **local_48;
  undefined4 local_3c;
  long local_38;
  int local_30;
  undefined4 local_2c;
  Mat *local_28;
  int local_20;
  undefined4 local_1c;
  Mat *local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  local_508 = in_RCX;
  local_500 = in_RDX;
  local_4f8 = in_RSI;
  if (*(int *)(in_RDI + 0xe0) == 0) {
    local_800 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  }
  else {
    local_800 = (const_reference)(in_RDI + 0x120);
  }
  local_510 = local_800;
  if (*(int *)(in_RDI + 0xe4) == 0) {
    if (*(int *)(in_RDI + 0xe0) == 0) {
      local_810 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4f8,1);
    }
    else {
      local_810 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4f8,0);
    }
    local_808 = local_810;
  }
  else {
    local_808 = (const_reference)(in_RDI + 0x168);
  }
  local_518 = local_808;
  local_4e0 = &local_560;
  local_560.data = (void *)0x0;
  local_560.refcount = (int *)0x0;
  local_560.elemsize = 0;
  local_560.elempack = 0;
  local_560.allocator = (Allocator *)0x0;
  local_560.dims = 0;
  local_560.w = 0;
  local_560.h = 0;
  local_560.d = 0;
  local_560.cstep = 0;
  if (*(int *)(in_RDI + 0xd8) == 0) {
    local_3a8 = &local_560;
    if (local_3a8 != local_510) {
      if (local_510->refcount != (int *)0x0) {
        piVar2 = local_510->refcount;
        local_3b4 = 1;
        LOCK();
        local_3b8 = *piVar2;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_560.data = local_510->data;
      local_560.refcount = local_510->refcount;
      local_560.elemsize = local_510->elemsize;
      local_560.elempack = local_510->elempack;
      local_560.allocator = local_510->allocator;
      local_560.dims = local_510->dims;
      local_560.w = local_510->w;
      local_560.d = local_510->d;
      local_560.cstep = local_510->cstep;
      local_268 = local_3a8;
    }
    local_3b0 = local_510;
    local_3a0 = local_3a8;
  }
  else if (local_510->elemsize == 1) {
    Mat::create(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8,
                CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c0);
    for (local_570 = 0; local_570 < local_560.h; local_570 = local_570 + 1) {
      local_324 = local_570;
      local_320 = &local_560;
      local_578 = (void *)((long)local_560.data +
                          (long)local_560.w * (long)local_570 * local_560.elemsize);
      for (local_57c = 0; local_57c < local_560.w; local_57c = local_57c + 1) {
        local_310 = local_510;
        local_314 = local_57c;
        *(undefined1 *)((long)local_578 + (long)local_57c) =
             *(undefined1 *)
              ((long)local_510->data +
              (long)local_570 + (long)local_510->w * (long)local_57c * local_510->elemsize);
      }
    }
  }
  else {
    Mat::create(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8,
                CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c0);
    for (local_580 = 0; local_580 < local_560.h; local_580 = local_580 + 1) {
      local_370 = &local_560;
      local_374 = local_580;
      local_588 = (void *)((long)local_560.data +
                          (long)local_560.w * (long)local_580 * local_560.elemsize);
      for (local_58c = 0; local_58c < local_560.w; local_58c = local_58c + 1) {
        local_5d9 = '\0';
        if (local_510->dims == 3) {
          local_2f8 = &local_5d8;
          local_4c = local_510->w;
          local_50 = local_510->h;
          local_54 = local_510->d;
          local_60 = (void *)((long)local_510->data +
                             local_510->cstep * (long)local_58c * local_510->elemsize);
          local_68 = local_510->elemsize;
          local_6c = local_510->elempack;
          local_78 = local_510->allocator;
          local_48 = &local_5d8;
          local_5d8 = local_60;
          local_5d0 = (int *)0x0;
          local_5c8 = local_68;
          local_5c0 = local_6c;
          local_5b8 = local_78;
          local_5ac = local_4c;
          local_5a8 = local_50;
          local_5a4 = 1;
          local_5a0 = local_54;
          local_38 = (long)local_4c * (long)local_50 * local_68;
          local_598 = (local_38 + 0xfU & 0xfffffffffffffff0) / local_68;
          local_5b0 = local_510->dims + -1;
          if (local_510->dims == 4) {
            local_598 = (long)local_510->w * (long)local_510->h;
          }
          local_3c = 0x10;
          local_300 = local_510;
          local_304 = local_58c;
          local_305 = 1;
          local_5d9 = '\x01';
          local_368 = (long)local_580;
          local_360 = &local_5d8;
          local_86c = *(undefined4 *)((long)local_60 + local_368 * 4);
        }
        else {
          local_2e0 = local_510;
          local_2e4 = local_58c;
          local_86c = *(undefined4 *)
                       ((long)local_510->data +
                       (long)local_580 * 4 +
                       (long)local_510->w * (long)local_58c * local_510->elemsize);
        }
        *(undefined4 *)((long)local_588 + (long)local_58c * 4) = local_86c;
        if (local_5d9 != '\0') {
          local_4c8 = &local_5d8;
          local_138 = local_4c8;
          if (local_5d0 != (int *)0x0) {
            local_13c = 0xffffffff;
            LOCK();
            local_140 = *local_5d0;
            *local_5d0 = *local_5d0 + -1;
            UNLOCK();
            if (local_140 == 1) {
              if (local_5b8 == (Allocator *)0x0) {
                local_130 = local_5d8;
                if (local_5d8 != (void *)0x0) {
                  free(local_5d8);
                }
              }
              else {
                (*local_5b8->_vptr_Allocator[3])(local_5b8,local_5d8);
              }
            }
          }
          local_5d8 = (void *)0x0;
          local_5c8 = 0;
          local_5c0 = 0;
          local_5b0 = 0;
          local_5ac = 0;
          local_5a8 = 0;
          local_5a4 = 0;
          local_5a0 = 0;
          local_598 = 0;
          local_5d0 = (int *)0x0;
        }
      }
    }
  }
  local_2d0 = &local_628;
  local_2d8 = &local_560;
  local_628.data = local_560.data;
  local_628.refcount = local_560.refcount;
  local_628.elemsize = local_560.elemsize;
  local_628.elempack = local_560.elempack;
  local_628.allocator = local_560.allocator;
  local_628.dims = local_560.dims;
  local_628.w = local_560.w;
  local_628.h = local_560.h;
  local_628.d = local_560.d;
  local_628.cstep = local_560.cstep;
  if (local_560.refcount != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_560.refcount;
    *local_560.refcount = *local_560.refcount + 1;
    UNLOCK();
  }
  local_2c8 = (long *)(in_RDI + 0x1f8);
  local_2c0 = &local_670;
  local_670.data = (void *)*local_2c8;
  local_670.refcount = *(int **)(in_RDI + 0x200);
  local_670.elemsize = *(size_t *)(in_RDI + 0x208);
  local_670.elempack = *(int *)(in_RDI + 0x210);
  local_670.allocator = *(Allocator **)(in_RDI + 0x218);
  local_670.dims = *(int *)(in_RDI + 0x220);
  local_670.w = *(int *)(in_RDI + 0x224);
  local_670.h = *(int *)(in_RDI + 0x228);
  local_670.d = *(int *)(in_RDI + 0x22c);
  local_670.c = *(int *)(in_RDI + 0x230);
  local_670.cstep = *(size_t *)(in_RDI + 0x238);
  if (local_670.refcount != (int *)0x0) {
    local_1c = 1;
    LOCK();
    local_20 = *local_670.refcount;
    *local_670.refcount = *local_670.refcount + 1;
    UNLOCK();
  }
  local_18 = local_2c0;
  local_8 = local_2d0;
  if (local_560.elemsize != 1) {
    Mat::create(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8,
                CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c0);
    Mat::create(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,
                CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c0);
    for (local_674 = 0; local_674 < local_628.h; local_674 = local_674 + 1) {
      if (local_560.dims == 3) {
        local_8ac = (int)local_560.cstep;
      }
      else {
        local_8ac = local_560.w;
      }
      local_678 = local_8ac;
      local_2a8 = &local_560;
      local_680 = (void *)((long)local_560.data + (long)(local_674 * local_8ac) * 4);
      local_684 = 0.0;
      for (local_688 = 0; local_688 < local_628.w; local_688 = local_688 + 1) {
        dVar6 = std::fabs((double)(ulong)*(uint *)((long)local_680 + (long)local_688 * 4));
        local_68c = SUB84(dVar6,0);
        pfVar4 = std::max<float>(&local_684,&local_68c);
        local_684 = *pfVar4;
      }
      if ((local_684 != 0.0) || (NAN(local_684))) {
        local_8cc = 127.0 / local_684;
      }
      else {
        local_8cc = 1.0;
      }
      local_690 = local_8cc;
      local_388 = (long)local_674;
      local_380 = &local_670;
      *(float *)((long)local_670.data + local_388 * 4) = local_8cc;
      local_330 = &local_628;
      local_334 = local_674;
      local_698 = (void *)((long)local_628.data +
                          (long)local_628.w * (long)local_674 * local_628.elemsize);
      for (local_69c = 0; local_69c < local_628.w; local_69c = local_69c + 1) {
        cVar3 = float2int8((float)in_stack_fffffffffffff5b0);
        *(char *)((long)local_698 + (long)local_69c) = cVar3;
      }
    }
  }
  local_2b0 = &local_6e8;
  local_2b8 = local_518;
  local_6e8.data = local_518->data;
  local_6e8.refcount = local_518->refcount;
  local_6e8.elemsize = local_518->elemsize;
  local_6e8.elempack = local_518->elempack;
  local_6e8.allocator = local_518->allocator;
  local_6e8.dims = local_518->dims;
  local_6e8.w = local_518->w;
  iVar1 = local_518->h;
  local_6e8.d = local_518->d;
  local_6e8.c = local_518->c;
  local_6e8.cstep = local_518->cstep;
  if (local_6e8.refcount != (int *)0x0) {
    local_2c = 1;
    LOCK();
    local_30 = *local_6e8.refcount;
    *local_6e8.refcount = *local_6e8.refcount + 1;
    UNLOCK();
  }
  local_6ec = *(float *)(in_RDI + 0x240);
  local_28 = local_2b0;
  if (local_6e8.elemsize != 1) {
    local_6e8.h = iVar1;
    Mat::create(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8,
                CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c0);
    local_6f0 = 0.0;
    for (local_6f4 = 0; local_6f4 < local_6e8.h; local_6f4 = local_6f4 + 1) {
      if (local_518->dims == 3) {
        local_90c = (int)local_518->cstep;
      }
      else {
        local_90c = local_518->w;
      }
      local_6f8 = local_90c;
      local_298 = local_518;
      local_700 = (void *)((long)local_518->data + (long)(local_6f4 * local_90c) * 4);
      for (local_704 = 0; local_704 < local_6e8.w; local_704 = local_704 + 1) {
        dVar6 = std::fabs((double)(ulong)*(uint *)((long)local_700 + (long)local_704 * 4));
        local_708 = SUB84(dVar6,0);
        pfVar4 = std::max<float>(&local_6f0,&local_708);
        local_6f0 = *pfVar4;
      }
    }
    if ((local_6f0 != 0.0) || (NAN(local_6f0))) {
      local_92c = 127.0 / local_6f0;
    }
    else {
      local_92c = 1.0;
    }
    local_6ec = local_92c;
    for (local_70c = 0; local_70c < local_6e8.h; local_70c = local_70c + 1) {
      if (local_518->dims == 3) {
        local_930 = (int)local_518->cstep;
      }
      else {
        local_930 = local_518->w;
      }
      local_710 = local_930;
      local_2a0 = local_518;
      local_718 = (void *)((long)local_518->data + (long)(local_70c * local_930) * 4);
      local_340 = &local_6e8;
      local_344 = local_70c;
      local_720 = (void *)((long)local_6e8.data +
                          (long)local_6e8.w * (long)local_70c * local_6e8.elemsize);
      for (local_724 = 0; local_724 < local_6e8.w; local_724 = local_724 + 1) {
        cVar3 = float2int8((float)in_stack_fffffffffffff5b0);
        *(char *)((long)local_720 + (long)local_724) = cVar3;
      }
    }
  }
  local_4d8 = &local_770;
  local_770.data = (void *)0x0;
  local_770.refcount = (int *)0x0;
  local_770.elemsize = 0;
  local_770.elempack = 0;
  local_770.allocator = (Allocator *)0x0;
  local_770.dims = 0;
  local_770.w = 0;
  local_770.h = 0;
  local_770.d = 0;
  local_770.c = 0;
  local_770.cstep = 0;
  if (*(int *)(in_RDI + 0xdc) == 0) {
    Mat::create(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8,
                CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c0);
    for (local_774 = 0; local_774 < local_770.h; local_774 = local_774 + 1) {
      local_354 = local_774;
      local_350 = &local_770;
      local_780 = (void *)((long)local_770.data +
                          (long)local_770.w * (long)local_774 * local_770.elemsize);
      for (local_784 = 0; local_784 < local_770.w; local_784 = local_784 + 1) {
        local_28c = local_784;
        local_288 = &local_6e8;
        *(undefined1 *)((long)local_780 + (long)local_784) =
             *(undefined1 *)
              ((long)local_6e8.data +
              (long)local_774 + (long)local_6e8.w * (long)local_784 * local_6e8.elemsize);
      }
    }
  }
  else {
    local_3c8 = &local_770;
    local_3d0 = &local_6e8;
    local_3c0 = local_3c8;
    if (local_3c8 != local_3d0) {
      if (local_6e8.refcount != (int *)0x0) {
        local_3d4 = 1;
        LOCK();
        local_3d8 = *local_6e8.refcount;
        *local_6e8.refcount = *local_6e8.refcount + 1;
        UNLOCK();
      }
      local_770.data = local_6e8.data;
      local_770.refcount = local_6e8.refcount;
      local_770.elemsize = local_6e8.elemsize;
      local_770.elempack = local_6e8.elempack;
      local_770.allocator = local_6e8.allocator;
      local_770.dims = local_6e8.dims;
      local_770.h = local_6e8.h;
      local_770.d = local_6e8.d;
      local_770.c = local_6e8.c;
      local_770.cstep = local_6e8.cstep;
      local_258 = local_3c8;
    }
  }
  local_788 = local_628.h;
  local_78c = local_770.h;
  local_4d0 = &local_7d8;
  local_7d8.data = (void *)0x0;
  local_7d8.refcount = (int *)0x0;
  local_7d8.elemsize = 0;
  local_7d8.elempack = 0;
  local_7d8.allocator = (Allocator *)0x0;
  local_7d8.dims = 0;
  local_7d8.w = 0;
  local_7d8.h = 0;
  local_7d8.d = 0;
  local_7d8.c = 0;
  local_7d8.cstep = 0;
  local_7dc = 0;
  if (*(int *)(in_RDI + 0xe8) == 0) {
    if (((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) ||
       (sVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4f8), sVar5 != 1)) {
      if (((*(int *)(in_RDI + 0xe0) == 0) && (*(int *)(in_RDI + 0xe4) == 0)) ||
         (sVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4f8), sVar5 != 2))
      {
        sVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_4f8);
        if (sVar5 == 3) {
          local_450 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4f8,2);
          local_448 = &local_7d8;
          local_440 = &local_7d8;
          if (&local_7d8 != local_450) {
            if (local_450->refcount != (int *)0x0) {
              piVar2 = local_450->refcount;
              local_454 = 1;
              LOCK();
              local_458 = *piVar2;
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            local_218 = &local_7d8;
            if (local_7d8.refcount != (int *)0x0) {
              local_21c = 0xffffffff;
              LOCK();
              local_220 = *local_7d8.refcount;
              *local_7d8.refcount = *local_7d8.refcount + -1;
              UNLOCK();
              if (local_220 == 1) {
                if (local_7d8.allocator == (Allocator *)0x0) {
                  local_c0 = local_7d8.data;
                  if (local_7d8.data != (void *)0x0) {
                    free(local_7d8.data);
                  }
                }
                else {
                  (*(local_7d8.allocator)->_vptr_Allocator[3])(local_7d8.allocator,local_7d8.data);
                }
              }
            }
            local_7d8.data = local_450->data;
            local_7d8.refcount = local_450->refcount;
            local_7d8.elemsize = local_450->elemsize;
            local_7d8.elempack = local_450->elempack;
            local_7d8.allocator = local_450->allocator;
            local_7d8.dims = local_450->dims;
            local_7d8.w = local_450->w;
            local_7d8.h = local_450->h;
            local_7d8.d = local_450->d;
            local_7d8.c = local_450->c;
            local_7d8.cstep = local_450->cstep;
          }
        }
      }
      else {
        local_430 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4f8,1);
        local_428 = &local_7d8;
        local_420 = &local_7d8;
        if (&local_7d8 != local_430) {
          if (local_430->refcount != (int *)0x0) {
            piVar2 = local_430->refcount;
            local_434 = 1;
            LOCK();
            local_438 = *piVar2;
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          local_228 = &local_7d8;
          if (local_7d8.refcount != (int *)0x0) {
            local_22c = 0xffffffff;
            LOCK();
            local_230 = *local_7d8.refcount;
            *local_7d8.refcount = *local_7d8.refcount + -1;
            UNLOCK();
            if (local_230 == 1) {
              if (local_7d8.allocator == (Allocator *)0x0) {
                local_b8 = local_7d8.data;
                if (local_7d8.data != (void *)0x0) {
                  free(local_7d8.data);
                }
              }
              else {
                (*(local_7d8.allocator)->_vptr_Allocator[3])(local_7d8.allocator,local_7d8.data);
              }
            }
          }
          local_7d8.data = local_430->data;
          local_7d8.refcount = local_430->refcount;
          local_7d8.elemsize = local_430->elemsize;
          local_7d8.elempack = local_430->elempack;
          local_7d8.allocator = local_430->allocator;
          local_7d8.dims = local_430->dims;
          local_7d8.w = local_430->w;
          local_7d8.h = local_430->h;
          local_7d8.d = local_430->d;
          local_7d8.c = local_430->c;
          local_7d8.cstep = local_430->cstep;
        }
      }
    }
    else {
      local_410 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_4f8,0);
      local_408 = &local_7d8;
      local_400 = &local_7d8;
      if (&local_7d8 != local_410) {
        if (local_410->refcount != (int *)0x0) {
          piVar2 = local_410->refcount;
          local_414 = 1;
          LOCK();
          local_418 = *piVar2;
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_238 = &local_7d8;
        if (local_7d8.refcount != (int *)0x0) {
          local_23c = 0xffffffff;
          LOCK();
          local_240 = *local_7d8.refcount;
          *local_7d8.refcount = *local_7d8.refcount + -1;
          UNLOCK();
          if (local_240 == 1) {
            if (local_7d8.allocator == (Allocator *)0x0) {
              local_b0 = local_7d8.data;
              if (local_7d8.data != (void *)0x0) {
                free(local_7d8.data);
              }
            }
            else {
              (*(local_7d8.allocator)->_vptr_Allocator[3])(local_7d8.allocator,local_7d8.data);
            }
          }
        }
        local_7d8.data = local_410->data;
        local_7d8.refcount = local_410->refcount;
        local_7d8.elemsize = local_410->elemsize;
        local_7d8.elempack = local_410->elempack;
        local_7d8.allocator = local_410->allocator;
        local_7d8.dims = local_410->dims;
        local_7d8.w = local_410->w;
        local_7d8.h = local_410->h;
        local_7d8.d = local_410->d;
        local_7d8.c = local_410->c;
        local_7d8.cstep = local_410->cstep;
      }
    }
    local_390 = &local_7d8;
    if (local_7d8.data != (void *)0x0) {
      local_88 = local_390;
    }
    if (local_7d8.data != (void *)0x0 && local_7d8.cstep * (long)local_7d8.c != 0) {
      local_7dc = 0;
      if ((local_7d8.dims == 1) && (local_7d8.w == local_788)) {
        local_7dc = 1;
      }
      if ((local_7d8.dims == 1) && (local_7d8.w == local_78c)) {
        local_7dc = 4;
      }
      if (((local_7d8.dims == 2) && (local_7d8.w == 1)) && (local_7d8.h == local_788)) {
        local_7dc = 2;
      }
      if (((local_7d8.dims == 2) && (local_7d8.w == local_78c)) && (local_7d8.h == local_788)) {
        local_7dc = 3;
      }
      if (((local_7d8.dims == 2) && (local_7d8.w == local_78c)) && (local_7d8.h == 1)) {
        local_7dc = 4;
      }
    }
  }
  else {
    local_3f0 = (value_type *)(in_RDI + 0x1b0);
    local_3e8 = &local_7d8;
    if (local_3e8 != local_3f0) {
      if (*(long *)(in_RDI + 0x1b8) != 0) {
        piVar2 = *(int **)(in_RDI + 0x1b8);
        local_3f4 = 1;
        LOCK();
        local_3f8 = *piVar2;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_7d8.data = local_3f0->data;
      local_7d8.refcount = *(int **)(in_RDI + 0x1b8);
      local_7d8.elemsize = *(size_t *)(in_RDI + 0x1c0);
      local_7d8.elempack = *(int *)(in_RDI + 0x1c8);
      local_7d8.allocator = *(Allocator **)(in_RDI + 0x1d0);
      local_7d8.d = *(int *)(in_RDI + 0x1e4);
      local_7d8.c = *(int *)(in_RDI + 0x1e8);
      local_7d8.cstep = *(size_t *)(in_RDI + 0x1f0);
      local_248 = local_3e8;
    }
    local_7dc = *(int *)(in_RDI + 0xf8);
    local_3e0 = local_3e8;
  }
  top_blob_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_500,0);
  if (*(int *)(in_RDI + 0x108) == 0) {
    if (*(int *)(in_RDI + 0xfc) == 0) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                  in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8,
                  (size_t)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
    }
    else {
      Mat::create(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8,
                  in_stack_fffffffffffff5d4,
                  CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                  in_stack_fffffffffffff5c0);
    }
  }
  else if (*(int *)(in_RDI + 0xfc) == 0) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8,
                (size_t)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  }
  else {
    Mat::create(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8,
                in_stack_fffffffffffff5d4,
                CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                in_stack_fffffffffffff5c0);
  }
  local_9d2 = true;
  if (top_blob_00->data != (void *)0x0) {
    local_9d2 = top_blob_00->cstep * (long)top_blob_00->c == 0;
    local_80 = top_blob_00;
  }
  local_398 = top_blob_00;
  if (local_9d2) {
    local_4e4 = -100;
  }
  else {
    gemm_transB_int8(&local_628,&local_770,&local_670,local_6ec,&local_7d8,top_blob_00,
                     *(float *)(in_RDI + 0xd0),*(float *)(in_RDI + 0xd4),local_7dc,
                     *(int *)(in_RDI + 0x108),local_508);
    local_4e4 = 0;
  }
  local_4b8 = &local_7d8;
  local_158 = local_4b8;
  if (local_7d8.refcount != (int *)0x0) {
    local_15c = 0xffffffff;
    LOCK();
    local_160 = *local_7d8.refcount;
    *local_7d8.refcount = *local_7d8.refcount + -1;
    UNLOCK();
    if (local_160 == 1) {
      if (local_7d8.allocator == (Allocator *)0x0) {
        local_120 = local_7d8.data;
        if (local_7d8.data != (void *)0x0) {
          free(local_7d8.data);
        }
      }
      else {
        (*(local_7d8.allocator)->_vptr_Allocator[3])(local_7d8.allocator,local_7d8.data);
      }
    }
  }
  local_7d8.data = (void *)0x0;
  local_7d8.elemsize = 0;
  local_7d8.elempack = 0;
  local_7d8.d = 0;
  local_7d8.c = 0;
  local_7d8.cstep = 0;
  local_7d8.refcount = (int *)0x0;
  local_4a8 = &local_770;
  local_178 = local_4a8;
  if (local_770.refcount != (int *)0x0) {
    local_17c = 0xffffffff;
    LOCK();
    local_180 = *local_770.refcount;
    *local_770.refcount = *local_770.refcount + -1;
    UNLOCK();
    if (local_180 == 1) {
      if (local_770.allocator == (Allocator *)0x0) {
        local_110 = local_770.data;
        if (local_770.data != (void *)0x0) {
          free(local_770.data);
        }
      }
      else {
        (*(local_770.allocator)->_vptr_Allocator[3])(local_770.allocator,local_770.data);
      }
    }
  }
  local_770.data = (void *)0x0;
  local_770.elemsize = 0;
  local_770.elempack = 0;
  local_770.dims = 0;
  local_770.d = 0;
  local_770.c = 0;
  local_770.cstep = 0;
  local_770.refcount = (int *)0x0;
  local_498 = &local_6e8;
  local_198 = local_498;
  if (local_6e8.refcount != (int *)0x0) {
    local_19c = 0xffffffff;
    LOCK();
    local_1a0 = *local_6e8.refcount;
    *local_6e8.refcount = *local_6e8.refcount + -1;
    UNLOCK();
    if (local_1a0 == 1) {
      if (local_6e8.allocator == (Allocator *)0x0) {
        local_100 = local_6e8.data;
        if (local_6e8.data != (void *)0x0) {
          free(local_6e8.data);
        }
      }
      else {
        (*(local_6e8.allocator)->_vptr_Allocator[3])(local_6e8.allocator,local_6e8.data);
      }
    }
  }
  local_6e8.data = (void *)0x0;
  local_6e8.elempack = 0;
  local_6e8.dims = 0;
  local_6e8.d = 0;
  local_6e8.c = 0;
  local_6e8.cstep = 0;
  local_6e8.refcount = (int *)0x0;
  local_488 = &local_670;
  local_1b8 = local_488;
  if (local_670.refcount != (int *)0x0) {
    local_1bc = 0xffffffff;
    LOCK();
    local_1c0 = *local_670.refcount;
    *local_670.refcount = *local_670.refcount + -1;
    UNLOCK();
    if (local_1c0 == 1) {
      if (local_670.allocator == (Allocator *)0x0) {
        local_f0 = local_670.data;
        if (local_670.data != (void *)0x0) {
          free(local_670.data);
        }
      }
      else {
        (*(local_670.allocator)->_vptr_Allocator[3])(local_670.allocator,local_670.data);
      }
    }
  }
  local_670.data = (void *)0x0;
  local_670.elemsize = 0;
  local_670.elempack = 0;
  local_670.dims = 0;
  local_670.w = 0;
  local_670.h = 0;
  local_670.d = 0;
  local_670.c = 0;
  local_670.cstep = 0;
  local_670.refcount = (int *)0x0;
  local_478 = &local_628;
  local_1d8 = local_478;
  if (local_628.refcount != (int *)0x0) {
    local_1dc = 0xffffffff;
    LOCK();
    local_1e0 = *local_628.refcount;
    *local_628.refcount = *local_628.refcount + -1;
    UNLOCK();
    if (local_1e0 == 1) {
      if (local_628.allocator == (Allocator *)0x0) {
        local_e0 = local_628.data;
        if (local_628.data != (void *)0x0) {
          free(local_628.data);
        }
      }
      else {
        (*(local_628.allocator)->_vptr_Allocator[3])(local_628.allocator,local_628.data);
      }
    }
  }
  local_628.data = (void *)0x0;
  local_628.elempack = 0;
  local_628.dims = 0;
  local_628.d = 0;
  local_628.c = 0;
  local_628.cstep = 0;
  local_628.refcount = (int *)0x0;
  local_468 = &local_560;
  if (local_560.refcount != (int *)0x0) {
    local_1fc = 0xffffffff;
    LOCK();
    local_200 = *local_560.refcount;
    *local_560.refcount = *local_560.refcount + -1;
    UNLOCK();
    if (local_200 == 1) {
      local_1f8 = local_468;
      if (local_560.allocator == (Allocator *)0x0) {
        local_d0 = local_560.data;
        if (local_560.data != (void *)0x0) {
          free(local_560.data);
        }
      }
      else {
        (*(local_560.allocator)->_vptr_Allocator[3])(local_560.allocator,local_560.data);
      }
    }
  }
  return local_4e4;
}

Assistant:

int Gemm::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        if (A0.elemsize == 1)
        {
            A.create(A0.h, A0.w, (size_t)1u, 1, opt.workspace_allocator);

            for (int i = 0; i < A.h; i++)
            {
                signed char* ptr = A.row<signed char>(i);
                for (int j = 0; j < A.w; j++)
                {
                    ptr[j] = A0.row<const signed char>(j)[i];
                }
            }
        }
        else
        {
            A.create(A0.dims == 3 ? A0.c : A0.h, A0.w, (size_t)4u, 1, opt.workspace_allocator);

            for (int i = 0; i < A.h; i++)
            {
                float* ptr = A.row(i);
                for (int j = 0; j < A.w; j++)
                {
                    ptr[j] = A0.dims == 3 ? A0.channel(j)[i] : A0.row(j)[i];
                }
            }
        }
    }

    // dynamic quantize A
    Mat A_int8 = A;
    Mat A_int8_scales = A_data_int8_scales;
    if (A_int8.elemsize != 1)
    {
        A_int8.create(A.w, A.dims == 3 ? A.c : A.h, (size_t)1u, 1, opt.workspace_allocator);
        A_int8_scales.create(A_int8.h, (size_t)4u, 1, opt.workspace_allocator);

        for (int i = 0; i < A_int8.h; i++)
        {
            const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
            const float* ptr = (const float*)A + i * A_hstep;

            float absmax = 0.f;
            for (int k = 0; k < A_int8.w; k++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[k]));
            }

            float A_int8_scale = absmax == 0.f ? 1.f : 127.f / absmax;
            A_int8_scales[i] = A_int8_scale;

            signed char* ptrAi = A_int8.row<signed char>(i);

            for (int k = 0; k < A_int8.w; k++)
            {
                ptrAi[k] = float2int8(ptr[k] * A_int8_scale);
            }
        }
    }

    // dynamic quantize B
    Mat B0_int8 = B0;
    float B_int8_scale = B_data_int8_scale;
    if (B0_int8.elemsize != 1)
    {
        B0_int8.create(B0.w, B0.dims == 3 ? B0.c : B0.h, (size_t)1u, 1, opt.workspace_allocator);

        float absmax = 0.f;
        for (int i = 0; i < B0_int8.h; i++)
        {
            const int B_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;
            const float* ptr = (const float*)B0 + i * B_hstep;

            for (int k = 0; k < B0_int8.w; k++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[k]));
            }
        }

        B_int8_scale = absmax == 0.f ? 1.f : 127.f / absmax;

        for (int i = 0; i < B0_int8.h; i++)
        {
            const int B_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;
            const float* ptr = (const float*)B0 + i * B_hstep;

            signed char* ptrBi = B0_int8.row<signed char>(i);

            for (int k = 0; k < B0_int8.w; k++)
            {
                ptrBi[k] = float2int8(ptr[k] * B_int8_scale);
            }
        }
    }

    Mat BT_int8;
    if (transB == 0)
    {
        // transpose B to col-major
        BT_int8.create(B0_int8.h, B0_int8.w, (size_t)1u, 1, opt.workspace_allocator);

        for (int i = 0; i < BT_int8.h; i++)
        {
            signed char* ptr = BT_int8.row<signed char>(i);
            for (int j = 0; j < BT_int8.w; j++)
            {
                ptr[j] = B0_int8.row<const signed char>(j)[i];
            }
        }
    }
    else
    {
        BT_int8 = B0_int8;
    }

    const int M = A_int8.h;
    const int N = BT_int8.h;

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB && bottom_blobs.size() == 1)
        {
            C = bottom_blobs[0];
        }
        else if ((constantA || constantB) && bottom_blobs.size() == 2)
        {
            C = bottom_blobs[1];
        }
        else if (bottom_blobs.size() == 3)
        {
            C = bottom_blobs[2];
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, 4u, opt.blob_allocator);
        else
            top_blob.create(M, N, 4u, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, 4u, opt.blob_allocator);
        else
            top_blob.create(N, M, 4u, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    gemm_transB_int8(A_int8, BT_int8, A_int8_scales, B_int8_scale, C, top_blob, alpha, beta, broadcast_type_C, output_transpose, opt);

    return 0;
}